

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderAtomicCompSwapCase::ShaderAtomicCompSwapCase
          (ShaderAtomicCompSwapCase *this,Context *context,char *name,AtomicOperandType operandType,
          DataType type,Precision precision)

{
  Precision precision_local;
  DataType type_local;
  AtomicOperandType operandType_local;
  char *name_local;
  Context *context_local;
  ShaderAtomicCompSwapCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,"atomicCompSwap() Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderAtomicCompSwapCase_032c1290;
  this->m_operandType = operandType;
  this->m_type = type;
  this->m_precision = precision;
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_workGroupSize,3,2,1);
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_numWorkGroups,4,4,4);
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

ShaderAtomicCompSwapCase::ShaderAtomicCompSwapCase (Context& context, const char* name, AtomicOperandType operandType, DataType type, Precision precision)
	: TestCase			(context, name, "atomicCompSwap() Test")
	, m_operandType		(operandType)
	, m_type			(type)
	, m_precision		(precision)
	, m_workGroupSize	(3,2,1)
	, m_numWorkGroups	(4,4,4)
	, m_program			(DE_NULL)
{
}